

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::addRows(Highs *this,HighsInt num_new_row,double *lower_bounds,double *upper_bounds,
              HighsInt num_new_nz,HighsInt *starts,HighsInt *indices,double *values)

{
  HighsStatus HVar1;
  allocator local_b1;
  string local_b0;
  HighsLogOptions local_90;
  
  logHeader(this);
  clearDerivedModelProperties(this);
  HighsLogOptions::HighsLogOptions(&local_90,&(this->options_).super_HighsOptionsStruct.log_options)
  ;
  HVar1 = addRowsInterface(this,num_new_row,lower_bounds,upper_bounds,num_new_nz,starts,indices,
                           values);
  std::__cxx11::string::string((string *)&local_b0,"addRows",&local_b1);
  HVar1 = interpretCallStatus(&local_90,HVar1,kOk,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  if (HVar1 == kError) {
    HVar1 = kError;
  }
  else {
    HVar1 = returnFromHighs(this,HVar1);
  }
  return HVar1;
}

Assistant:

HighsStatus Highs::addRows(const HighsInt num_new_row,
                           const double* lower_bounds,
                           const double* upper_bounds,
                           const HighsInt num_new_nz, const HighsInt* starts,
                           const HighsInt* indices, const double* values) {
  this->logHeader();
  HighsStatus return_status = HighsStatus::kOk;
  clearDerivedModelProperties();
  return_status = interpretCallStatus(
      options_.log_options,
      addRowsInterface(num_new_row, lower_bounds, upper_bounds, num_new_nz,
                       starts, indices, values),
      return_status, "addRows");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}